

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle_settings.cpp
# Opt level: O2

ostream * cornelich::operator<<(ostream *os,vanilla_chronicle_settings *s)

{
  ostream *poVar1;
  __type_conflict1 _Var2;
  
  poVar1 = std::operator<<(os,"- path                   = ");
  poVar1 = std::operator<<(poVar1,(string *)s);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"- cycle_length           = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->m_cycle_length);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"- entries_per_cycle      = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," [");
  _Var2 = std::log2<long>(s->m_entries_per_cycle);
  poVar1 = std::ostream::_M_insert<double>(_Var2);
  poVar1 = std::operator<<(poVar1," bits]\n");
  poVar1 = std::operator<<(poVar1,"- index_block_size       = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," [");
  _Var2 = std::log2<long>(s->m_index_block_size);
  poVar1 = std::ostream::_M_insert<double>(_Var2);
  poVar1 = std::operator<<(poVar1," bits]\n");
  poVar1 = std::operator<<(poVar1,"- data_block_size        = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," [");
  _Var2 = std::log2<long>(s->m_data_block_size);
  poVar1 = std::ostream::_M_insert<double>(_Var2);
  poVar1 = std::operator<<(poVar1," bits]\n");
  poVar1 = std::operator<<(poVar1,"- thread_id_bits         = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->m_thread_id_bits);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"- thread_id_mask         = 0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"- index_data_offset_bits = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x40 - s->m_thread_id_bits);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"- index_data_offset_mask = 0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::operator<<(poVar1,"- index_cache_size       = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"- data_cache_size        = ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const vanilla_chronicle_settings & s)
{
    os << "- path                   = " << s.path() << '\n'
       << "- cycle_length           = " << s.cycle_length() << '\n'
       << "- entries_per_cycle      = " << s.entries_per_cycle() << " [" << std::log2(s.entries_per_cycle()) << " bits]\n"
       << "- index_block_size       = " << s.index_block_size() << " [" << std::log2(s.index_block_size()) << " bits]\n"
       << "- data_block_size        = " << s.data_block_size() << " [" << std::log2(s.data_block_size()) << " bits]\n"
       << "- thread_id_bits         = " << s.thread_id_bits() << '\n'
       << "- thread_id_mask         = 0x" << std::hex << s.thread_id_mask() << std::dec << '\n'
       << "- index_data_offset_bits = " << s.index_data_offset_bits() << '\n'
       << "- index_data_offset_mask = 0x" << std::hex << s.index_data_offset_mask() << std::dec
       << "- index_cache_size       = " << s.index_cache_size() << '\n'
       << "- data_cache_size        = " << s.data_cache_size();
    return os;
}